

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

int FindHostApi(PaDeviceIndex device,int *hostSpecificDeviceIndex)

{
  bool bVar1;
  int local_1c;
  int i;
  int *hostSpecificDeviceIndex_local;
  PaDeviceIndex device_local;
  
  local_1c = 0;
  if (initializationCount_ == 0) {
    hostSpecificDeviceIndex_local._4_4_ = -1;
  }
  else {
    hostSpecificDeviceIndex_local._0_4_ = device;
    if (device < 0) {
      hostSpecificDeviceIndex_local._4_4_ = -1;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (local_1c < hostApisCount_) {
          bVar1 = (hostApis_[local_1c]->info).deviceCount <=
                  (PaDeviceIndex)hostSpecificDeviceIndex_local;
        }
        if (!bVar1) break;
        hostSpecificDeviceIndex_local._0_4_ =
             (PaDeviceIndex)hostSpecificDeviceIndex_local - (hostApis_[local_1c]->info).deviceCount;
        local_1c = local_1c + 1;
      }
      if (local_1c < hostApisCount_) {
        if (hostSpecificDeviceIndex != (int *)0x0) {
          *hostSpecificDeviceIndex = (PaDeviceIndex)hostSpecificDeviceIndex_local;
        }
        hostSpecificDeviceIndex_local._4_4_ = local_1c;
      }
      else {
        hostSpecificDeviceIndex_local._4_4_ = -1;
      }
    }
  }
  return hostSpecificDeviceIndex_local._4_4_;
}

Assistant:

static int FindHostApi( PaDeviceIndex device, int *hostSpecificDeviceIndex )
{
    int i=0;

    if( !PA_IS_INITIALISED_ )
        return -1;

    if( device < 0 )
        return -1;

    while( i < hostApisCount_
            && device >= hostApis_[i]->info.deviceCount )
    {

        device -= hostApis_[i]->info.deviceCount;
        ++i;
    }

    if( i >= hostApisCount_ )
        return -1;

    if( hostSpecificDeviceIndex )
        *hostSpecificDeviceIndex = device;

    return i;
}